

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::Pxr24Compressor::uncompress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  byte bVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  InputExc *this_00;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  int iVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  uint pixel;
  uLongf tmpSize;
  int local_54;
  ulong local_50;
  uint local_48;
  int local_44;
  char **local_40;
  ulong local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  local_50 = (long)this->_numScanLines * (long)this->_maxScanLineSize;
  iVar4 = ::uncompress(this->_tmpBuffer,&local_50,inPtr,(long)inSize);
  if (iVar4 == 0) {
    local_44 = (range->max).x;
    if (this->_maxX < local_44) {
      local_44 = this->_maxX;
    }
    local_48 = (range->max).y;
    if (this->_maxY < (int)local_48) {
      local_48 = this->_maxY;
    }
    uVar19 = (range->min).y;
    pbVar10 = this->_tmpBuffer;
    pcVar17 = this->_outBuffer;
    local_40 = outPtr;
    if ((int)uVar19 <= (int)local_48) {
      iVar4 = (range->min).x;
      do {
        cVar7._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
        cVar8._M_node = (_Base_ptr)ChannelList::end(this->_channels);
        if (cVar7._M_node != cVar8._M_node) {
          local_38 = (ulong)~uVar19;
          pbVar13 = pbVar10;
          do {
            uVar2 = *(uint *)&cVar7._M_node[9]._M_parent;
            if ((int)uVar19 < 0) {
              if (-1 < (int)uVar2) {
                uVar5 = ((int)local_38 + uVar2) / uVar2;
                goto LAB_00488e2d;
              }
              uVar5 = (~uVar2 - uVar19) / -uVar2;
            }
            else if ((int)uVar2 < 0) {
              uVar5 = uVar19 / -uVar2;
LAB_00488e2d:
              uVar5 = -uVar5;
            }
            else {
              uVar5 = uVar19 / uVar2;
            }
            pbVar10 = pbVar13;
            if (uVar19 == uVar5 * uVar2) {
              iVar6 = numSamples(*(int *)&cVar7._M_node[9].field_0x4,iVar4,local_44);
              local_54 = 0;
              _Var3 = cVar7._M_node[9]._M_color;
              if (_Var3 == 2) {
                pbVar11 = pbVar13 + iVar6;
                pbVar14 = pbVar11 + iVar6;
                pbVar10 = pbVar14 + iVar6;
                if (local_50 < (ulong)((long)pbVar10 - (long)this->_tmpBuffer)) {
LAB_00489058:
                  anon_unknown_10::notEnoughData();
                  goto LAB_0048905d;
                }
                if (0 < iVar6) {
                  iVar16 = 0;
                  do {
                    pcVar12 = pcVar17;
                    local_54 = local_54 +
                               ((uint)*pbVar14 << 8 |
                               (uint)*pbVar11 << 0x10 | (uint)*pbVar13 << 0x18);
                    lVar18 = 0;
                    do {
                      pcVar12[lVar18] = *(char *)((long)&local_54 + lVar18);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 4);
                    pbVar13 = pbVar13 + 1;
                    pbVar11 = pbVar11 + 1;
                    pbVar14 = pbVar14 + 1;
                    iVar16 = iVar16 + 1;
                    pcVar17 = pcVar12 + 4;
                  } while (iVar16 != iVar6);
                  pcVar17 = pcVar12 + 4;
                }
              }
              else if (_Var3 == _S_black) {
                lVar18 = (long)iVar6;
                pbVar10 = pbVar13 + lVar18 * 2;
                if (local_50 < (ulong)((long)pbVar10 - (long)this->_tmpBuffer)) goto LAB_00489058;
                if (0 < iVar6) {
                  local_54 = 0;
                  do {
                    bVar1 = *pbVar13;
                    pbVar11 = pbVar13 + lVar18;
                    pbVar13 = pbVar13 + 1;
                    local_54 = local_54 + (uint)CONCAT11(bVar1,*pbVar11);
                    *(short *)pcVar17 = (short)local_54;
                    pcVar17 = pcVar17 + 2;
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
              }
              else if (_Var3 == _S_red) {
                pbVar11 = pbVar13 + iVar6;
                pbVar14 = pbVar11 + iVar6;
                pbVar15 = pbVar14 + iVar6;
                pbVar10 = pbVar15 + iVar6;
                if (local_50 < (ulong)((long)pbVar10 - (long)this->_tmpBuffer)) goto LAB_00489058;
                if (0 < iVar6) {
                  iVar16 = 0;
                  do {
                    pcVar12 = pcVar17;
                    local_54 = local_54 +
                               ((uint)*pbVar15 |
                               (uint)*pbVar14 << 8 | (uint)*pbVar11 << 0x10 | (uint)*pbVar13 << 0x18
                               );
                    lVar18 = 0;
                    do {
                      pcVar12[lVar18] = *(char *)((long)&local_54 + lVar18);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 4);
                    pbVar13 = pbVar13 + 1;
                    pbVar11 = pbVar11 + 1;
                    pbVar14 = pbVar14 + 1;
                    pbVar15 = pbVar15 + 1;
                    iVar16 = iVar16 + 1;
                    pcVar17 = pcVar12 + 4;
                  } while (iVar16 != iVar6);
                  pcVar17 = pcVar12 + 4;
                }
              }
            }
            cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
            CVar9 = ChannelList::end(this->_channels);
            pbVar13 = pbVar10;
          } while ((const_iterator)cVar7._M_node != CVar9._i._M_node);
        }
        bVar20 = uVar19 != local_48;
        uVar19 = uVar19 + 1;
      } while (bVar20);
    }
    if (local_50 <= (ulong)((long)pbVar10 - (long)this->_tmpBuffer)) {
      *local_40 = this->_outBuffer;
      return (int)pcVar17 - *(int *)&this->_outBuffer;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    pcVar17 = "Error decompressing data (input data are longer than expected).";
  }
  else {
LAB_0048905d:
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    pcVar17 = "Data decompression (zlib) failed.";
  }
  Iex_2_5::InputExc::InputExc(this_00,pcVar17);
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

int		
Pxr24Compressor::uncompress (const char *inPtr,
			     int inSize,
			     Box2i range,
			     const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    uLongf tmpSize = _maxScanLineSize * _numScanLines;

    if (Z_OK != ::uncompress ((Bytef *)_tmpBuffer,
			      &tmpSize,
			      (const Bytef *) inPtr,
			      inSize))
    {
	throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    const unsigned char *tmpBufferEnd = _tmpBuffer;
    char *writePtr = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    const unsigned char *ptr[4];
	    unsigned int pixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8) |
					 *(ptr[3]++);

		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

        if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 8) |
					 *(ptr[1]++);

		    pixel += diff;

		    half * hPtr = (half *) writePtr;
		    hPtr->setBits ((unsigned short) pixel);
		    writePtr += sizeof (half);
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

        if ( (uLongf) (tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8);
		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    if ((uLongf) (tmpBufferEnd - _tmpBuffer) < tmpSize)
	tooMuchData();

    outPtr = _outBuffer;
    return writePtr - _outBuffer;
}